

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

shared_ptr<pstack::Elf::Object> __thiscall
pstack::Context::getImageForName(Context *this,string *name,bool isDebug)

{
  element_type *peVar1;
  __shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined7 in_register_00000011;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<pstack::Elf::Object> sVar2;
  undefined1 local_50 [16];
  _Base_ptr local_40;
  shared_ptr<pstack::Elf::Object> res;
  bool isDebug_local;
  
  getImageIfLoaded((Context *)&local_40,name);
  peVar1 = res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_40 == (_Base_ptr)0x0) {
    std::make_shared<pstack::MmapReader,pstack::Context&,std::__cxx11::string_const&>
              ((Context *)local_50,name);
    std::make_shared<pstack::Elf::Object,pstack::Context&,std::shared_ptr<pstack::MmapReader>,bool&>
              (this,(shared_ptr<pstack::MmapReader> *)name,(bool *)local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
    this_00 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pstack::Elf::Object>_>_>_>
                             *)&name[1].field_2,(key_type *)CONCAT71(in_register_00000011,isDebug))
               ->super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,(__shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2> *)this);
  }
  else {
    *(_Base_ptr *)&(this->dwarfCache)._M_t._M_impl = local_40;
    res.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    *(element_type **)&(this->dwarfCache)._M_t._M_impl.super__Rb_tree_header._M_header = peVar1;
    local_40 = (_Base_ptr)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&res);
  sVar2.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<pstack::Elf::Object>)
         sVar2.super___shared_ptr<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Elf::Object>
Context::getImageForName(const std::string &name, bool isDebug) {
    auto res = getImageIfLoaded(name);
    if (res != nullptr)
        return res;
    auto item = std::make_shared<Elf::Object>(*this, std::make_shared<MmapReader>(*this, name), isDebug);
    // don't cache negative entries: assign into the cache after we've constructed:
    // a failure to load the image will throw.
    elfCache[name] = item;
    return item;
}